

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O0

void __thiscall CircBufTest::test3(CircBufTest *this)

{
  int iVar1;
  ostream *poVar2;
  uint local_3b4;
  int local_3b0;
  int i_3;
  int size_3;
  int local_3a4;
  int offset_3;
  int j_3;
  int i_2;
  int size_2;
  int local_390;
  int offset_2;
  int j_2;
  int i_1;
  int size_1;
  int offset_1;
  int j_1;
  int i;
  int size;
  int offset;
  int j;
  int count;
  uint8_t trashBuf [128];
  uint8_t dumpBuf [128];
  uint8_t buf [128];
  CircularBuffer local_1d0 [8];
  CircularBuffer bigBuf;
  CircularBuffer local_f0 [8];
  CircularBuffer tinyBuf;
  CircBufTest *this_local;
  
  JetHead::CircularBuffer::CircularBuffer(local_f0,1);
  JetHead::CircularBuffer::CircularBuffer(local_1d0,0x40);
  offset = 0;
  std::iota<unsigned_char*,unsigned_char>(dumpBuf + 0x78,buf + 0x38,'\0');
  std::iota<unsigned_char*,unsigned_char>(buf + 0x38,buf + 0x78,'\0');
  for (size = 1; size < 0x80; size = size + 1) {
    iVar1 = rand();
    i = iVar1 % size;
    JetHead::CircularBuffer::write_overflow((uchar *)local_1d0,(int)dumpBuf + 0x78);
    JetHead::CircularBuffer::copy((uchar *)local_1d0,(int)trashBuf + 0x78);
    JetHead::CircularBuffer::read((uchar *)local_1d0,(int)&j);
    for (offset = 0; offset < 0x80; offset = j_1 + offset) {
      iVar1 = rand();
      j_1 = iVar1 % 5;
      if (0x80 < offset + j_1) {
        j_1 = 0x80 - offset;
      }
      JetHead::CircularBuffer::write_overflow((uchar *)local_1d0,(int)dumpBuf + 0x78 + offset);
    }
    JetHead::CircularBuffer::copy((uchar *)local_1d0,(int)trashBuf + 0x78);
    JetHead::CircularBuffer::read((uchar *)local_1d0,(int)&j);
    for (offset_1 = 0; offset_1 < 0x40; offset_1 = offset_1 + 1) {
      if (dumpBuf[(long)offset_1 + 0x78] != trashBuf[(long)offset_1 + 0x78]) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"dumpBuf: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)trashBuf[(long)offset_1 + 0x78]);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x227,"Random start smallish write_overflow test failed.");
      }
    }
  }
  for (size_1 = 1; size_1 < 0x80; size_1 = size_1 + 1) {
    iVar1 = rand();
    i_1 = iVar1 % size_1;
    JetHead::CircularBuffer::write_overflow((uchar *)local_1d0,(int)dumpBuf + 0x78);
    JetHead::CircularBuffer::copy((uchar *)local_1d0,(int)trashBuf + 0x78);
    JetHead::CircularBuffer::read((uchar *)local_1d0,(int)&j);
    for (offset = 0; offset < 0x80; offset = j_2 + offset) {
      iVar1 = rand();
      j_2 = iVar1 % 0x32;
      if (0x80 < offset + j_2) {
        j_2 = 0x80 - offset;
      }
      JetHead::CircularBuffer::write_overflow((uchar *)local_1d0,(int)dumpBuf + 0x78 + offset);
    }
    JetHead::CircularBuffer::copy((uchar *)local_1d0,(int)trashBuf + 0x78);
    JetHead::CircularBuffer::read((uchar *)local_1d0,(int)&j);
    for (offset_2 = 0; offset_2 < 0x40; offset_2 = offset_2 + 1) {
      if (dumpBuf[(long)offset_2 + 0x78] != trashBuf[(long)offset_2 + 0x78]) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x24e," Random start bigish write_overflow test failed.");
      }
    }
  }
  for (local_390 = 1; local_390 < 0x80; local_390 = local_390 + 1) {
    iVar1 = rand();
    size_2 = iVar1 % local_390;
    JetHead::CircularBuffer::write_overflow((uchar *)local_1d0,(int)dumpBuf + 0x78);
    JetHead::CircularBuffer::copy((uchar *)local_1d0,(int)trashBuf + 0x78);
    JetHead::CircularBuffer::read((uchar *)local_1d0,(int)&j);
    JetHead::CircularBuffer::write_overflow((uchar *)local_1d0,(int)dumpBuf + 0x78);
    i_2 = 0;
    std::fill<unsigned_char*,int>(trashBuf + 0x78,dumpBuf + 0x78,&i_2);
    for (offset = 0; offset < 0x40; offset = j_3 + offset) {
      iVar1 = rand();
      j_3 = iVar1 % 5;
      if (0x40 < offset + j_3) {
        j_3 = 0x40 - offset;
      }
      JetHead::CircularBuffer::copy((uchar *)local_1d0,(int)trashBuf + 0x78 + offset);
      JetHead::CircularBuffer::read((uchar *)local_1d0,(int)&j + offset);
    }
    for (offset_3 = 0; offset_3 < 0x40; offset_3 = offset_3 + 1) {
      if ((uint)trashBuf[(long)offset_3 + 0x78] != offset_3) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x275,"smallish read failed.");
      }
    }
  }
  for (local_3a4 = 1; local_3a4 < 0x80; local_3a4 = local_3a4 + 1) {
    iVar1 = rand();
    size_3 = iVar1 % local_3a4;
    JetHead::CircularBuffer::write_overflow((uchar *)local_1d0,(int)dumpBuf + 0x78);
    JetHead::CircularBuffer::copy((uchar *)local_1d0,(int)trashBuf + 0x78);
    JetHead::CircularBuffer::read((uchar *)local_1d0,(int)&j);
    JetHead::CircularBuffer::write_overflow((uchar *)local_1d0,(int)dumpBuf + 0x78);
    i_3 = 0;
    std::fill<unsigned_char*,int>(trashBuf + 0x78,dumpBuf + 0x78,&i_3);
    for (offset = 0; offset < 0x40; offset = local_3b0 + offset) {
      local_3b0 = rand();
      local_3b0 = local_3b0 % 0x32;
      if (0x40 < offset + local_3b0) {
        local_3b0 = 0x40 - offset;
      }
      JetHead::CircularBuffer::copy((uchar *)local_1d0,(int)trashBuf + 0x78 + offset);
      JetHead::CircularBuffer::read((uchar *)local_1d0,(int)&j + offset);
    }
    for (local_3b4 = 0; (int)local_3b4 < 0x40; local_3b4 = local_3b4 + 1) {
      if (trashBuf[(long)(int)local_3b4 + 0x78] != local_3b4) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x29f,"big reads failed.");
      }
    }
  }
  JetHead::CircularBuffer::~CircularBuffer(local_1d0);
  JetHead::CircularBuffer::~CircularBuffer(local_f0);
  return;
}

Assistant:

void CircBufTest::test3()
{

	// Like test2 but using bigBug instead of heapBuf,
	// write_overflow instead of write, and copy instead of read

	CircularBuffer tinyBuf = CircularBuffer(1);
	CircularBuffer bigBuf = CircularBuffer(BUFFER_SIZE / 2 );

	uint8_t buf[BUFFER_SIZE];
	uint8_t dumpBuf[BUFFER_SIZE];
	uint8_t trashBuf[BUFFER_SIZE];

	int count = 0;

	iota(buf, buf + (BUFFER_SIZE / 2), (uint8_t) 0);
	iota(buf + (BUFFER_SIZE / 2), buf + BUFFER_SIZE, (uint8_t) 0);


	// 1st Test: use one arg constructor to make a heapBuf, fill it
	// with a bunch of small writes, then make sure it worked.

	for (int j = 1; j < BUFFER_SIZE; j++)
	{
		int offset = rand() % j;

		// Just want to advance starting position.
		bigBuf.write_overflow(buf, offset );
		bigBuf.copy(dumpBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));
		bigBuf.read(trashBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));

		count = 0;
		while (count < BUFFER_SIZE)
		{

			int size = rand() % 5;

			if ( (count + size) > BUFFER_SIZE)
				size = BUFFER_SIZE - count;

			bigBuf.write_overflow(buf + count, size);
			count += size;
		}


		bigBuf.copy(dumpBuf, BUFFER_SIZE / 2 );
		bigBuf.read(trashBuf, BUFFER_SIZE / 2 );


		for( int i = 0; i < BUFFER_SIZE / 2; i++)
		{
			if ( buf[i] != dumpBuf[i] )
			{
				cerr << "dumpBuf: " << (int)dumpBuf[i] << endl;
				TestFailed("Random start smallish write_overflow test failed.") ;
			}
		}
	}

	// 2st Test: use one arg constructor to make a bigBuf, fill it
	// with a bunch of big writes, then make sure it worked.

	for (int j = 1; j < BUFFER_SIZE; j++)
	{
		int offset = rand() % j;

		// Just want to advance starting position.
		bigBuf.write_overflow(buf, offset );
		bigBuf.copy(dumpBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));
		bigBuf.read(trashBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));

		count = 0;
		while (count < BUFFER_SIZE)
		{

			int size = rand() % 50;

			if ( (count + size) > BUFFER_SIZE)
				size = BUFFER_SIZE - count;

			bigBuf.write_overflow(buf + count, size);
			count += size;
		}


		bigBuf.copy(dumpBuf, BUFFER_SIZE / 2 );
		bigBuf.read(trashBuf, BUFFER_SIZE / 2 );


		for( int i = 0; i < BUFFER_SIZE / 2; i++)
		{
			if ( buf[i] != dumpBuf[i] )
			{
				TestFailed(" Random start bigish write_overflow test failed.") ;
			}
		}
	}


	// 3nd Test: refill buffer, read small bits at a time.
	for (int j = 1; j < BUFFER_SIZE; j++)
	{
		int offset = rand() % j;

		// Just want to advance starting position.
		bigBuf.write_overflow(buf, offset );
		bigBuf.copy(dumpBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));
		bigBuf.read(trashBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));

		bigBuf.write_overflow(buf, BUFFER_SIZE );

		// Why use a for loop when you can do it the C++ way?
		fill(dumpBuf, dumpBuf + BUFFER_SIZE, 0);


		count = 0;
		while( count < BUFFER_SIZE / 2)
		{

			int size = rand() % 5;

			if ( (count + size) > BUFFER_SIZE / 2)
				size = ( BUFFER_SIZE / 2) - count;

			bigBuf.copy(dumpBuf + count , size);
			bigBuf.read(trashBuf + count , size);
			count += size;
		}

		for( int i = 0; i < BUFFER_SIZE / 2; i++ )
		{
			if( dumpBuf[i] != i)
				TestFailed("smallish read failed.");

		}
	}



	// 4th Test: refill buffer, big bits at a time.
	for (int j = 1; j < BUFFER_SIZE; j++)
	{
		int offset = rand() % j;

		// Just want to advance starting position.
		bigBuf.write_overflow(buf, offset );
		bigBuf.copy(dumpBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));
		bigBuf.read(trashBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));


		bigBuf.write_overflow(buf, BUFFER_SIZE );

		// Why use a for loop when you can do it the C++ way?
		fill(dumpBuf, dumpBuf + BUFFER_SIZE, 0);


		count = 0;
		while( count < BUFFER_SIZE / 2)
		{

			int size = rand() % 50;

			if ( (count + size) > BUFFER_SIZE / 2)
				size = (BUFFER_SIZE / 2) - count;

			bigBuf.copy(dumpBuf + count , size);
			bigBuf.read(trashBuf + count , size);
			count += size;

		}

		for( int i = 0; i < BUFFER_SIZE / 2; i++ )
		{
			if( dumpBuf[i] != i )
				TestFailed("big reads failed.");

		}

	}

}